

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Driver.cpp
# Opt level: O2

SourceFile * __thiscall hdc::Driver::parseFile(Driver *this,string *path)

{
  Logger *this_00;
  bool bVar1;
  SourceFile *sfile;
  size_t in_RCX;
  void *__buf;
  Driver *this_01;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  string local_120 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  undefined1 local_e0 [32];
  string local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  Parser parser;
  
  parser.filePath._M_dataplus._M_p = (pointer)&parser.filePath.field_2;
  parser.tokens.super__Vector_base<hdc::Token,_std::allocator<hdc::Token>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  parser.current_token._M_current = (Token *)0x0;
  parser.tokens.super__Vector_base<hdc::Token,_std::allocator<hdc::Token>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  parser.tokens.super__Vector_base<hdc::Token,_std::allocator<hdc::Token>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  parser.matched._M_current = (Token *)0x0;
  parser.filePath._M_string_length = 0;
  parser.filePath.field_2._M_local_buf[0] = '\0';
  std::operator+(&local_140,"parsing file \'",path);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (local_e0 + 0x40),&local_140,"\'");
  this_00 = &this->logger;
  Logger::log(this_00,(double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da));
  std::__cxx11::string::~string((string *)(local_e0 + 0x40));
  std::__cxx11::string::~string((string *)&local_140);
  std::__cxx11::string::string((string *)(local_e0 + 0x20),(string *)path);
  sfile = Program::getSourceFile(&this->program,(string *)(local_e0 + 0x20));
  std::__cxx11::string::~string((string *)(local_e0 + 0x20));
  if (sfile == (SourceFile *)0x0) {
    this_01 = (Driver *)local_e0;
    std::__cxx11::string::string((string *)this_01,(string *)path);
    bVar1 = fileExists(this_01,(string *)local_e0);
    std::__cxx11::string::~string((string *)local_e0);
    if (bVar1) {
      Parser::setLogger(&parser,this_00);
      std::__cxx11::string::string(local_120,(string *)path);
      sfile = (SourceFile *)Parser::read(&parser,(int)local_120,__buf,in_RCX);
      std::__cxx11::string::~string(local_120);
      Program::addSourceFile(&this->program,sfile);
    }
    else {
      std::operator+(&local_140,"couldn\'t find file or directory \'",path);
      std::operator+(&local_100,&local_140,"\'");
      Logger::log(this_00,(double)CONCAT44(extraout_XMM0_Db_00,extraout_XMM0_Da_00));
      std::__cxx11::string::~string((string *)&local_100);
      std::__cxx11::string::~string((string *)&local_140);
      Logger::quit(this_00);
      sfile = (SourceFile *)0x0;
    }
  }
  Parser::~Parser(&parser);
  return sfile;
}

Assistant:

SourceFile* Driver::parseFile(std::string path) {
    Parser parser;
    SourceFile* file;

    logger.log(LOG_INTERNAL_DRIVER, "parsing file '" + path + "'");
    file = program.getSourceFile(path);

    if (file != nullptr) {
        return file;
    }

    if (!fileExists(path)) {
        logger.log(LOG_ERROR, "couldn't find file or directory '" + path + "'");
        logger.quit();
        return nullptr;
    }

    parser.setLogger(&logger);
    file = parser.read(path);
    program.addSourceFile(file);

    return file;
}